

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perseus.cpp
# Opt level: O1

void __thiscall Perseus::PlanLeadIn(Perseus *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int *p_Var2;
  pointer pcVar3;
  ostream *poVar4;
  string local_40;
  
  p_Var2 = this->_vptr_Perseus[-3];
  paVar1 = &local_40.field_2;
  pcVar3 = (this->_m_identification)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar3,pcVar3 + (this->_m_identification)._M_string_length);
  TimedAlgorithm::StartTimer
            ((TimedAlgorithm *)((long)&this->_vptr_Perseus + (long)p_Var2),&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (this->_m_beliefsInitialized == false) {
    srand(0x2a);
    if (-1 < this->_m_verbose) {
      pcVar3 = (this->_m_identification)._M_dataplus._M_p;
      local_40._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar3,pcVar3 + (this->_m_identification)._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": sampling ",0xb);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,1000);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," beliefs",8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    std::ostream::flush();
    (*this->_vptr_Perseus[1])(this,1000,1);
    if (-1 < this->_m_verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
    }
  }
  PrintMaxRewardInBeliefSet(this);
  return;
}

Assistant:

void Perseus::PlanLeadIn()
{
    StartTimer(GetIdentification());

    if(!_m_beliefsInitialized)
    {
        int nrB=1000;
        // set the random seed and sample beliefs
        srand(42);
        if(GetVerbose() >= 0)
            cout << GetIdentification() << ": sampling " << nrB
                 << " beliefs"; cout.flush();
        InitializeBeliefs(nrB,true);
        if(GetVerbose() >= 0)
            cout << "." << endl;
    }

    // just a manual check to figure out if the belief set has potential
    PrintMaxRewardInBeliefSet();
}